

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ArgOut<true>
          (ByteCodeWriter *this,ArgSlot arg,RegSlot reg,ProfileId callSiteId,bool emitProfiledArgout
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ProfileId local_1a;
  bool success_1;
  bool success;
  OpCode op;
  bool emitProfiledArgout_local;
  ProfileId callSiteId_local;
  RegSlot reg_local;
  ArgSlot arg_local;
  ByteCodeWriter *this_local;
  
  local_1a = callSiteId;
  _success_1 = reg;
  callSiteId_local = arg;
  _reg_local = this;
  CheckOpen(this);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_A);
  if ((!bVar2) || (bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_ANonVar), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2c3,
                                "(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar))"
                                ,
                                "OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  _success_1 = ConsumeReg(this,_success_1);
  if ((((emitProfiledArgout) && (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2)) &&
      (callSiteId_local != 0)) &&
     (((callSiteId_local < 0xd && (1 < _success_1)) && (local_1a != 0xffff)))) {
    bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,ProfiledArgOut_A,callSiteId_local,_success_1);
    if (((!bVar2) &&
        (bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,ProfiledArgOut_A,callSiteId_local,_success_1), !bVar2)) &&
       (bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,ProfiledArgOut_A,callSiteId_local,_success_1), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x2db,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Data::Encode(&this->m_byteCodeData,&local_1a,2);
  }
  else {
    bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,ArgOut_A,callSiteId_local,_success_1);
    if (((!bVar2) &&
        (bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,ArgOut_A,callSiteId_local,_success_1), !bVar2)) &&
       (bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,ArgOut_A,callSiteId_local,_success_1), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x2e0,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::ArgOut(ArgSlot arg, RegSlot reg, ProfileId callSiteId, bool emitProfiledArgout)
    {
        CheckOpen();
        Assert(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar));

        // Note: don't "consume" the arg slot, as the passed-in value is the final one.
        reg = ConsumeReg(reg);

        OpCode op;
        if (isVar)
        {
            op = OpCode::ArgOut_A;
        }
        else
        {
            op = OpCode::ArgOut_ANonVar;
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }

        if (emitProfiledArgout
            && DoDynamicProfileOpcode(InlinePhase)
            && arg > 0 && arg < Js::Constants::MaximumArgumentCountForConstantArgumentInlining
            && reg > FunctionBody::FirstRegSlot
            && callSiteId != Js::Constants::NoProfileId
            )
        {
            MULTISIZE_LAYOUT_WRITE(Arg, Js::OpCode::ProfiledArgOut_A, arg, reg);
            m_byteCodeData.Encode(&callSiteId, sizeof(Js::ProfileId));
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }
    }